

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O0

Status google::protobuf::(anonymous_namespace)::
       Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                 (char *args,basic_string_view<char,_std::char_traits<char>_> args_1,char *args_2)

{
  string_view pc;
  Nullable<const_char_*> in_R8;
  AlphaNum local_108;
  char *local_d8;
  size_t sStack_d0;
  AlphaNum local_c0;
  AlphaNum local_90;
  undefined1 local_60 [48];
  Nullable<const_char_*> local_30;
  char *args_local_2;
  char *args_local;
  basic_string_view<char,_std::char_traits<char>_> args_local_1;
  
  args_local = args_1._M_str;
  args_local_2 = (char *)args_1._M_len;
  local_30 = in_R8;
  args_local_1._M_len = (size_t)args_2;
  args_local_1._M_str = args;
  absl::lts_20240722::AlphaNum::AlphaNum(&local_90,args_local_2);
  local_d8 = args_local;
  sStack_d0 = args_local_1._M_len;
  pc._M_str = (char *)args_local_1._M_len;
  pc._M_len = (size_t)args_local;
  absl::lts_20240722::AlphaNum::AlphaNum(&local_c0,pc);
  absl::lts_20240722::AlphaNum::AlphaNum(&local_108,local_30);
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_60,&local_90,&local_c0);
  local_60._32_16_ = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
  absl::lts_20240722::FailedPreconditionError(args,local_60._32_8_,local_60._40_8_);
  std::__cxx11::string::~string((string *)local_60);
  return (Status)(uintptr_t)args;
}

Assistant:

absl::Status Error(Args... args) {
  return absl::FailedPreconditionError(absl::StrCat(args...));
}